

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phong.hpp
# Opt level: O0

void __thiscall Phong::Phong(Phong *this,Json *conf)

{
  bool bVar1;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_RDI;
  pointer pbVar2;
  vec3f vVar3;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffef0;
  char (*in_stack_ffffffffffffff00) [4];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff08;
  Json *in_stack_ffffffffffffff30;
  float local_c8;
  char *in_stack_ffffffffffffff68;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff70;
  _Base_ptr local_70;
  float local_68;
  
  BxDF::BxDF((BxDF *)&in_RDI[1].m_it);
  BRDF::BRDF((BRDF *)in_RDI,&PTR_construction_vtable_24__001e84d8);
  in_RDI->m_object = (pointer)&PTR_sample_f_001e8490;
  ((json_value *)&in_RDI[1].m_it)->object = (object_t *)&PTR_f_001e84c0;
  vec3f::vec3f((vec3f *)&in_RDI->m_it);
  vec3f::vec3f((vec3f *)((long)&in_RDI->m_it + 0xc));
  in_RDI[1].m_object = (pointer)0x0;
  *(undefined4 *)((long)&in_RDI->m_it + (long)in_RDI->m_object[-2].m_value.object) = 2;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[3]>(in_stack_ffffffffffffff08,(char (*) [3])in_stack_ffffffffffffff00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_RDI);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(in_stack_fffffffffffffef0,in_RDI);
  if (bVar1) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    vVar3 = json2vec3f(in_stack_ffffffffffffff30);
    local_70 = vVar3._0_8_;
    local_68 = vVar3.z;
    (in_RDI->m_it).object_iterator._M_node = local_70;
    *(float *)&(in_RDI->m_it).array_iterator._M_current = local_68;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[3]>(in_stack_ffffffffffffff08,(char (*) [3])in_stack_ffffffffffffff00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_RDI);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(in_stack_fffffffffffffef0,in_RDI);
  if (bVar1) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    vVar3 = json2vec3f(in_stack_ffffffffffffff30);
    local_c8 = vVar3.z;
    *(long *)((long)&(in_RDI->m_it).array_iterator._M_current + 4) = vVar3._0_8_;
    *(float *)((long)&(in_RDI->m_it).primitive_iterator.m_it + 4) = local_c8;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[4]>(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_RDI);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(in_stack_fffffffffffffef0,in_RDI);
  if (bVar1) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pbVar2 = (pointer)nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::operator_double<double,_0>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)0x193774);
    in_RDI[1].m_object = pbVar2;
  }
  return;
}

Assistant:

Phong(const Json& conf)
	{
		flags = REFLECT;
		if (conf.find("Ka") != conf.end()) Ka = json2vec3f(conf["Ka"]);
		if (conf.find("Ks") != conf.end()) Ks = json2vec3f(conf["Ks"]);
		if (conf.find("exp") != conf.end()) exp = conf["exp"];
	}